

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

Error asmjit::v1_14::Formatter::formatFuncValuePack
                (String *sb,FormatFlags formatFlags,BaseCompiler *cc,FuncValuePack *pack,
                RegOnly *vRegs)

{
  uint32_t uVar1;
  Error EVar2;
  String *sb_00;
  FuncValuePack *in_RCX;
  long in_RDX;
  String *in_RDI;
  long in_R8;
  Error _err_2;
  VirtReg *virtReg;
  Error _err_1;
  Error _err;
  FuncValue *value;
  uint32_t valueIndex;
  size_t count;
  undefined4 in_stack_fffffffffffffe98;
  uint32_t in_stack_fffffffffffffe9c;
  char *in_stack_fffffffffffffea0;
  BaseCompiler *in_stack_fffffffffffffea8;
  BaseEmitter *in_stack_fffffffffffffeb0;
  String *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  ModifyOp op;
  BaseCompiler *in_stack_fffffffffffffec8;
  VirtReg *local_128;
  uint local_104;
  Error local_cc;
  
  op = (ModifyOp)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  uVar1 = FuncValuePack::count(in_RCX);
  if (uVar1 == 0) {
    local_cc = String::_opString((String *)in_stack_fffffffffffffec8,op,
                                 (char *)in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0
                                );
  }
  else {
    if (1 < uVar1) {
      String::_opChar((String *)in_stack_fffffffffffffea8,
                      (ModifyOp)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                      (char)((ulong)in_stack_fffffffffffffea0 >> 0x18));
    }
    local_104 = 0;
    while ((local_104 < uVar1 &&
           (sb_00 = (String *)
                    FuncValuePack::operator[]
                              ((FuncValuePack *)in_stack_fffffffffffffea0,
                               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),
           *(uint32_t *)sb_00 != 0))) {
      if ((local_104 != 0) &&
         (EVar2 = String::_opString((String *)in_stack_fffffffffffffec8,
                                    (ModifyOp)((ulong)sb_00 >> 0x20),
                                    (char *)in_stack_fffffffffffffeb8,
                                    (size_t)in_stack_fffffffffffffeb0), EVar2 != 0)) {
        return EVar2;
      }
      EVar2 = formatFuncValue(sb_00,(FormatFlags)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                              in_stack_fffffffffffffeb0,
                              (FuncValue)(uint32_t)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      if (EVar2 != 0) {
        return EVar2;
      }
      if (in_R8 != 0) {
        local_128 = (VirtReg *)0x0;
        if ((*(int *)(in_R8 + (ulong)local_104 * 8) != 0) &&
           (*(int *)(in_R8 + (ulong)local_104 * 8 + 4) - 0x100U < *(uint *)(in_RDX + 0x1f0))) {
          local_128 = BaseCompiler::virtRegById
                                ((BaseCompiler *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c
                                );
        }
        if (local_128 == (VirtReg *)0x0) {
          in_stack_fffffffffffffea0 = "<none>";
        }
        else {
          in_stack_fffffffffffffeb0 = (BaseEmitter *)(local_128 + 0x18);
          if (*(uint *)&in_stack_fffffffffffffeb0->_vptr_BaseEmitter < 0xc) {
            in_stack_fffffffffffffea0 = (char *)(local_128 + 0x1c);
            in_stack_fffffffffffffea8 = (BaseCompiler *)in_stack_fffffffffffffea0;
          }
          else {
            in_stack_fffffffffffffea0 = *(char **)(local_128 + 0x20);
            in_stack_fffffffffffffea8 = (BaseCompiler *)in_stack_fffffffffffffea0;
          }
        }
        in_stack_fffffffffffffeb8 = in_RDI;
        in_stack_fffffffffffffec8 = (BaseCompiler *)in_stack_fffffffffffffea0;
        EVar2 = String::_opFormat(in_RDI,kAppend," %s",in_stack_fffffffffffffea0);
        if (EVar2 != 0) {
          return EVar2;
        }
      }
      local_104 = local_104 + 1;
    }
    if (1 < uVar1) {
      String::_opChar((String *)in_stack_fffffffffffffea8,
                      (ModifyOp)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                      (char)((ulong)in_stack_fffffffffffffea0 >> 0x18));
    }
    local_cc = 0;
  }
  return local_cc;
}

Assistant:

static Error formatFuncValuePack(
  String& sb,
  FormatFlags formatFlags,
  const BaseCompiler* cc,
  const FuncValuePack& pack,
  const RegOnly* vRegs) noexcept {

  size_t count = pack.count();
  if (!count)
    return sb.append("void");

  if (count > 1)
    sb.append('[');

  for (uint32_t valueIndex = 0; valueIndex < count; valueIndex++) {
    const FuncValue& value = pack[valueIndex];
    if (!value)
      break;

    if (valueIndex)
      ASMJIT_PROPAGATE(sb.append(", "));

    ASMJIT_PROPAGATE(formatFuncValue(sb, formatFlags, cc, value));

    if (vRegs) {
      const VirtReg* virtReg = nullptr;
      static const char nullReg[] = "<none>";

      if (vRegs[valueIndex].isReg() && cc->isVirtIdValid(vRegs[valueIndex].id()))
        virtReg = cc->virtRegById(vRegs[valueIndex].id());

      ASMJIT_PROPAGATE(sb.appendFormat(" %s", virtReg ? virtReg->name() : nullReg));
    }
  }

  if (count > 1)
    sb.append(']');

  return kErrorOk;
}